

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O2

void * disk_read_thread(void *args)

{
  fdb_status fVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  fdb_doc *doc;
  ulong local_60;
  fdb_kvs_handle *snap_db;
  fdb_snapshot_info_t *markers;
  uint64_t num_markers;
  timeval __test_begin;
  
  uVar4 = 0;
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  fdb_doc_create(&doc,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
  do {
    if ((int)uVar4 == 10) {
      fdb_doc_free(doc);
      return (void *)0x0;
    }
    local_60 = uVar4;
    fVar1 = fdb_get_all_snap_markers(*args,&markers,&num_markers);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
              ,700);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                    ,700,"void *disk_read_thread(void *)");
    }
    lVar3 = 0x10;
    uVar4 = 0;
    while( true ) {
      if (num_markers <= uVar4) break;
      iVar2 = (int)*(undefined8 *)(*(long *)((long)&markers->marker + lVar3) + 8);
      if (iVar2 != 0) {
        fVar1 = fdb_snapshot_open(*(fdb_kvs_handle **)((long)args + 8),&snap_db,(long)iVar2);
        if (fVar1 == FDB_RESULT_SUCCESS) {
          doc->seqnum = (long)iVar2;
          fVar1 = fdb_get_byseq(snap_db,doc);
          if (fVar1 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                    ,0x2c8);
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                          ,0x2c8,"void *disk_read_thread(void *)");
          }
          if (iVar2 < *(int *)((long)doc->body + 0xe08)) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                    ,0x2cc);
            __assert_fail("p.age <= seqno",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                          ,0x2cc,"void *disk_read_thread(void *)");
          }
        }
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x18;
    }
    fdb_free_snap_markers(markers,num_markers);
    uVar4 = (ulong)((int)local_60 + 1);
  } while( true );
}

Assistant:

void *disk_read_thread(void *args) {
    TEST_INIT();
    int n;
    uint64_t i;
    int seqno;
    uint64_t num_markers;
    fdb_snapshot_info_t *markers;
    fdb_kvs_handle *snap_db;
    fdb_status status;
    fdb_doc *doc;
    person_t p;
    fdb_doc_create(&doc, NULL, 0, NULL, 0, NULL, 0);

    storage_t *st = (storage_t *)args;

    for (n = 0; n < 10; ++n) {
        status = fdb_get_all_snap_markers(st->main, &markers,
                                          &num_markers);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        for (i = 0; i < num_markers; i++) {
            // open disk snapshot to each marker
            seqno = markers[i].kvs_markers[0].seqnum;
            if (!seqno) {
                continue;
            }
            status = fdb_snapshot_open(st->all_docs, &snap_db, seqno);
            if (status == FDB_RESULT_SUCCESS) {
                doc->seqnum = seqno;
                // can get doc
                status = fdb_get_byseq(snap_db, doc);
                TEST_CHK(status == FDB_RESULT_SUCCESS);

                // verify
                memcpy(&p, (person_t *)doc->body, sizeof(person_t));
                TEST_CHK(p.age <= seqno)
            }
        }
        fdb_free_snap_markers(markers, num_markers);
    }

    fdb_doc_free(doc);
    return NULL;
}